

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O2

void set_primary_rc_buffer_sizes(AV1EncoderConfig *oxcf,AV1_PRIMARY *ppi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (oxcf->rc_cfg).target_bandwidth;
  lVar1 = (oxcf->rc_cfg).optimal_buffer_level_ms;
  lVar3 = (oxcf->rc_cfg).maximum_buffer_size_ms;
  (ppi->p_rc).starting_buffer_level = ((oxcf->rc_cfg).starting_buffer_level_ms * lVar2) / 1000;
  if (lVar1 == 0) {
    lVar1 = lVar2 / 8;
  }
  else {
    lVar1 = (lVar1 * lVar2) / 1000;
  }
  (ppi->p_rc).optimal_buffer_level = lVar1;
  if (lVar3 == 0) {
    lVar2 = lVar2 / 8;
  }
  else {
    lVar2 = (lVar3 * lVar2) / 1000;
  }
  (ppi->p_rc).maximum_buffer_size = lVar2;
  lVar1 = (ppi->p_rc).buffer_level;
  lVar3 = (ppi->p_rc).bits_off_target;
  if (lVar2 <= lVar3) {
    lVar3 = lVar2;
  }
  (ppi->p_rc).bits_off_target = lVar3;
  if (lVar1 < lVar2) {
    lVar2 = lVar1;
  }
  (ppi->p_rc).buffer_level = lVar2;
  return;
}

Assistant:

static inline void set_primary_rc_buffer_sizes(const AV1EncoderConfig *oxcf,
                                               AV1_PRIMARY *ppi) {
  PRIMARY_RATE_CONTROL *p_rc = &ppi->p_rc;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  const int64_t bandwidth = rc_cfg->target_bandwidth;
  const int64_t starting = rc_cfg->starting_buffer_level_ms;
  const int64_t optimal = rc_cfg->optimal_buffer_level_ms;
  const int64_t maximum = rc_cfg->maximum_buffer_size_ms;

  p_rc->starting_buffer_level = starting * bandwidth / 1000;
  p_rc->optimal_buffer_level =
      (optimal == 0) ? bandwidth / 8 : optimal * bandwidth / 1000;
  p_rc->maximum_buffer_size =
      (maximum == 0) ? bandwidth / 8 : maximum * bandwidth / 1000;

  // Under a configuration change, where maximum_buffer_size may change,
  // keep buffer level clipped to the maximum allowed buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  p_rc->buffer_level = AOMMIN(p_rc->buffer_level, p_rc->maximum_buffer_size);
}